

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

int eia608_to_utf8(uint16_t c,int *chan,char *str1,char *str2)

{
  int iVar1;
  utf8_char_t *in_RDX;
  int size;
  int c2;
  int c1;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  uint16_t in_stack_ffffffffffffffd2;
  undefined4 local_28;
  undefined4 local_24;
  
  iVar1 = eia608_to_index(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  utf8_from_index(local_24);
  utf8_char_copy(in_RDX,(utf8_char_t *)in_stack_ffffffffffffffb8);
  utf8_from_index(local_28);
  utf8_char_copy(in_RDX,(utf8_char_t *)in_stack_ffffffffffffffb8);
  return iVar1;
}

Assistant:

int eia608_to_utf8(uint16_t c, int* chan, char* str1, char* str2)
{
    int c1, c2;
    int size = (int)eia608_to_index(c, chan, &c1, &c2);
    utf8_char_copy(str1, utf8_from_index(c1));
    utf8_char_copy(str2, utf8_from_index(c2));
    return size;
}